

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpMessage.cpp
# Opt level: O1

string * FIX::HttpMessage::createResponse(string *__return_storage_ptr__,int error,string *text)

{
  ostream *poVar1;
  char *pcVar2;
  string errorString;
  stringstream response;
  char *local_1d8;
  long local_1d0;
  char local_1c8;
  undefined7 uStack_1c7;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1d0 = 0;
  local_1c8 = '\0';
  if (error < 300) {
    switch(error) {
    case 200:
      pcVar2 = "OK";
      break;
    case 0xc9:
      pcVar2 = "Created";
      break;
    case 0xca:
      pcVar2 = "Accepted";
      break;
    case 0xcb:
      pcVar2 = "Non-Authoritative Information";
      break;
    case 0xcc:
      pcVar2 = "No Content";
      break;
    case 0xcd:
      pcVar2 = "Reset Content";
      break;
    case 0xce:
      pcVar2 = "Partial Content";
      break;
    default:
      if (error == 100) {
        pcVar2 = "Continue";
        break;
      }
      if (error == 0x65) {
        pcVar2 = "Switching Protocols";
        break;
      }
      goto switchD_00186cd9_caseD_132;
    }
    goto LAB_00186f97;
  }
  switch(error) {
  case 400:
    pcVar2 = "Bad Request";
    break;
  case 0x191:
    pcVar2 = "Unauthorized";
    break;
  case 0x192:
    pcVar2 = "Payment Required";
    break;
  case 0x193:
    pcVar2 = "Forbidden";
    break;
  case 0x194:
    pcVar2 = "Not Found";
    break;
  case 0x195:
    pcVar2 = "Method Not Allowed";
    break;
  case 0x196:
    pcVar2 = "Not Acceptable";
    break;
  case 0x197:
    pcVar2 = "Proxy Authentication Required";
    break;
  case 0x198:
    pcVar2 = "Request Timeout";
    break;
  case 0x199:
    pcVar2 = "Conflict";
    break;
  case 0x19a:
    pcVar2 = "Gone";
    break;
  case 0x19b:
    pcVar2 = "Length Required";
    break;
  case 0x19c:
    pcVar2 = "Precondition Failed";
    break;
  case 0x19d:
    pcVar2 = "Request Entity Too Large";
    break;
  case 0x19e:
    pcVar2 = "Request-URI Too Large";
    break;
  case 0x19f:
    pcVar2 = "Unsupported Media Type";
    break;
  case 0x1a0:
    pcVar2 = "Requested Range Not Satisfiable";
    break;
  case 0x1a1:
    pcVar2 = "Expectation Failed";
    break;
  default:
    switch(error) {
    case 300:
      pcVar2 = "Multiple Choices";
      break;
    case 0x12d:
      pcVar2 = "Moved Permanently";
      break;
    case 0x12e:
      pcVar2 = "Found";
      break;
    case 0x12f:
      pcVar2 = "See Other";
      break;
    case 0x130:
      pcVar2 = "Not Modified";
      break;
    case 0x131:
      pcVar2 = "Use Proxy";
      break;
    case 0x132:
switchD_00186cd9_caseD_132:
      pcVar2 = "Unknown";
      break;
    case 0x133:
      pcVar2 = "Temporary Redirect";
      break;
    default:
      switch(error) {
      case 500:
        pcVar2 = "Internal Server Error";
        break;
      case 0x1f5:
        pcVar2 = "Not Implemented";
        break;
      case 0x1f6:
        pcVar2 = "Bad Gateway";
        break;
      case 0x1f7:
        pcVar2 = "Service Unavailable";
        break;
      case 0x1f8:
        pcVar2 = "Gateway Timeout";
        break;
      case 0x1f9:
        pcVar2 = "HTTP Version not supported";
        break;
      default:
        goto switchD_00186cd9_caseD_132;
      }
    }
  }
LAB_00186f97:
  local_1d8 = &local_1c8;
  std::__cxx11::string::_M_replace((ulong)&local_1d8,0,(char *)0x0,(ulong)pcVar2);
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"HTTP/1.1 ",9);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,error);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_1d8,local_1d0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\r\n",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Server: QuickFIX",0x10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\r\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"Content-Type: text/html; charset=iso-8859-1",0x2b);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\r\n\r\n",4);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"<!DOCTYPE HTML PUBLIC \"-//IETF//DTD HTML 2.0//EN\">",0x32);
  if (error - 300U < 0xffffff9c) {
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"<HTML><HEAD><TITLE>",0x13);
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,error);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_1d8,local_1d0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"</TITLE></HEAD><BODY>",0x15);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"<H1>",4);
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,error);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_1d8,local_1d0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"</H1>",5);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,(text->_M_dataplus)._M_p,text->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"</BODY></HTML>",0xe);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,(text->_M_dataplus)._M_p,text->_M_string_length);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  if (local_1d8 != &local_1c8) {
    operator_delete(local_1d8,CONCAT71(uStack_1c7,local_1c8) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string HttpMessage::createResponse(int error, const std::string &text) {
  std::string errorString;
  switch (error) {
  case 100:
    errorString = "Continue";
    break;
  case 101:
    errorString = "Switching Protocols";
    break;
  case 200:
    errorString = "OK";
    break;
  case 201:
    errorString = "Created";
    break;
  case 202:
    errorString = "Accepted";
    break;
  case 203:
    errorString = "Non-Authoritative Information";
    break;
  case 204:
    errorString = "No Content";
    break;
  case 205:
    errorString = "Reset Content";
    break;
  case 206:
    errorString = "Partial Content";
    break;
  case 300:
    errorString = "Multiple Choices";
    break;
  case 301:
    errorString = "Moved Permanently";
    break;
  case 302:
    errorString = "Found";
    break;
  case 303:
    errorString = "See Other";
    break;
  case 304:
    errorString = "Not Modified";
    break;
  case 305:
    errorString = "Use Proxy";
    break;
  case 307:
    errorString = "Temporary Redirect";
    break;
  case 400:
    errorString = "Bad Request";
    break;
  case 401:
    errorString = "Unauthorized";
    break;
  case 402:
    errorString = "Payment Required";
    break;
  case 403:
    errorString = "Forbidden";
    break;
  case 404:
    errorString = "Not Found";
    break;
  case 405:
    errorString = "Method Not Allowed";
    break;
  case 406:
    errorString = "Not Acceptable";
    break;
  case 407:
    errorString = "Proxy Authentication Required";
    break;
  case 408:
    errorString = "Request Timeout";
    break;
  case 409:
    errorString = "Conflict";
    break;
  case 410:
    errorString = "Gone";
    break;
  case 411:
    errorString = "Length Required";
    break;
  case 412:
    errorString = "Precondition Failed";
    break;
  case 413:
    errorString = "Request Entity Too Large";
    break;
  case 414:
    errorString = "Request-URI Too Large";
    break;
  case 415:
    errorString = "Unsupported Media Type";
    break;
  case 416:
    errorString = "Requested Range Not Satisfiable";
    break;
  case 417:
    errorString = "Expectation Failed";
    break;
  case 500:
    errorString = "Internal Server Error";
    break;
  case 501:
    errorString = "Not Implemented";
    break;
  case 502:
    errorString = "Bad Gateway";
    break;
  case 503:
    errorString = "Service Unavailable";
    break;
  case 504:
    errorString = "Gateway Timeout";
    break;
  case 505:
    errorString = "HTTP Version not supported";
    break;
  default:
    errorString = "Unknown";
  }

  std::stringstream response;
  response << "HTTP/1.1 " << error << " " << errorString << "\r\n"
           << "Server: QuickFIX" << "\r\n"
           << "Content-Type: text/html; charset=iso-8859-1" << "\r\n\r\n"
           << "<!DOCTYPE HTML PUBLIC \"-//IETF//DTD HTML 2.0//EN\">";

  if (error < 200 || error >= 300) {
    response << "<HTML><HEAD><TITLE>" << error << " " << errorString << "</TITLE></HEAD><BODY>"
             << "<H1>" << error << " " << errorString << "</H1>" << text << "</BODY></HTML>";
  } else {
    response << text;
  }

  return response.str();
}